

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcFragDepthTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::FragDepthCompareCase::iterate(FragDepthCompareCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderContext *pRVar2;
  code *pcVar3;
  void *pvVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 uVar9;
  int iVar10;
  undefined4 extraout_var;
  int *piVar12;
  NotSupportedError *this_00;
  TestError *pTVar13;
  char *description;
  long lVar14;
  int iVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  FragDepthCompareCase *pFVar17;
  float fVar18;
  float fVar19;
  float coord [8];
  float varyingDepthCoord [16];
  Surface referenceFrame;
  float constDepthCoord [16];
  Surface renderedFrame;
  ProgramSources sources;
  ShaderProgram basicQuadProgram;
  Random rnd;
  allocator<char> local_365;
  float local_364;
  FragDepthCompareCase *local_360;
  float local_354;
  value_type local_350;
  allocator<char> local_329;
  undefined1 local_328 [8];
  void *pvStack_320;
  deUint16 *local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_310;
  int local_300;
  string local_2f8;
  undefined1 local_2d8 [8];
  undefined1 *puStack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined8 local_2b8;
  ulong uStack_2b0;
  undefined1 *local_2a8;
  undefined8 uStack_2a0;
  Surface local_290;
  TestLog *local_278;
  float local_26c;
  value_type local_268;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 *local_238;
  undefined8 uStack_230;
  Surface local_220;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  int local_1e0;
  pointer local_1d8;
  pointer pbStack_1d0;
  int local_1c8;
  value_type *local_1c0;
  PrimitiveType local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  pointer pbStack_180;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_178;
  undefined1 local_158 [40];
  string local_130;
  undefined1 local_110 [152];
  deUint32 local_78;
  bool local_50;
  deRandom local_40;
  long lVar11;
  undefined4 extraout_var_00;
  
  local_278 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar8);
  local_360 = this;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar12 = (int *)CONCAT44(extraout_var_00,iVar7);
  iVar7 = *piVar12;
  iVar15 = 0x80;
  if (iVar7 < 0x80) {
    iVar15 = iVar7;
  }
  iVar10 = 0x80;
  if (piVar12[1] < 0x80) {
    iVar10 = piVar12[1];
  }
  dVar8 = deRandom_getUint32(&local_40);
  local_364 = (float)(dVar8 % ((iVar7 - iVar15) + 1U));
  iVar7 = piVar12[1];
  dVar8 = deRandom_getUint32(&local_40);
  local_354 = (float)(dVar8 % ((iVar7 - iVar10) + 1U));
  tcu::Surface::Surface(&local_220,iVar15,iVar10);
  tcu::Surface::Surface(&local_290,iVar15,iVar10);
  if (piVar12[6] == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0x9b);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar11 + 0x1a00))(local_364,local_354,iVar15,iVar10);
  (**(code **)(lVar11 + 0x188))(0x4500);
  (**(code **)(lVar11 + 0x5e0))(0xb71);
  pFVar17 = local_360;
  pRVar2 = ((local_360->super_TestCase).m_context)->m_renderCtx;
  local_328 = (undefined1  [8])&local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,
             "${VERSION_DECL}\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n   gl_Position = a_position;\n   v_coord = a_coord;\n}\n"
             ,"");
  specializeVersion((string *)local_2d8,(string *)local_328,pFVar17->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,(char *)local_2d8,&local_365);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             "${VERSION_DECL}\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n   o_color = u_color;\n}\n"
             ,"");
  specializeVersion(&local_2f8,&local_130,local_360->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,local_2f8._M_dataplus._M_p,&local_329);
  local_158[0x10] = 0;
  local_158._17_8_ = 0;
  local_158._0_8_ = (pointer)0x0;
  local_158[8] = 0;
  local_158._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_208,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208,&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1f0,&local_350);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,pRVar2,(ProgramSources *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_178);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  paVar1 = &local_350.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328,(long)local_318 + 1);
  }
  if (local_50 == false) {
    glu::operator<<(local_278,(ShaderProgram *)local_110);
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0xad);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_238 = (undefined1 *)0x3f80000000000000;
  uStack_230 = 0x3f8000003dcccccd;
  local_248 = 0xbf80000000000000;
  uStack_240 = 0x3f8000003dcccccd;
  local_268.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_268.field_2._8_8_ = 0x3f8000003dcccccd;
  local_268._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_268._M_string_length = 0x3f8000003dcccccd;
  local_2a8 = &DAT_3f8000003f800000;
  uStack_2a0 = 0x3f800000bf800000;
  local_2b8 = 0xbf8000003f800000;
  uStack_2b0 = 0x3f80000000000000;
  local_2c8._M_allocated_capacity = 0x3f80000000000000;
  local_2c8._8_8_ = 0x3f80000000000000;
  local_2d8 = (undefined1  [8])0xbf80000000000000;
  puStack_2d0 = &DAT_3f8000003f800000;
  (**(code **)(lVar11 + 0x1680))(local_78);
  pcVar3 = *(code **)(lVar11 + 0x15a0);
  uVar9 = (**(code **)(lVar11 + 0xb48))(local_78,"u_color");
  (*pcVar3)(0,0,0x3f800000,0x3f800000,uVar9);
  (**(code **)(lVar11 + 0x4a0))(0x207);
  local_350._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"a_position","");
  local_328._0_4_ = 1;
  pvStack_320 = &aStack_310;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pvStack_320,local_350._M_dataplus._M_p,
             local_350._M_dataplus._M_p + local_350._M_string_length);
  local_300 = 0;
  local_208._0_4_ = local_328._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pvStack_320,(long)local_318 + (long)pvStack_320);
  local_1e0 = local_300;
  local_1d8 = (pointer)0x8;
  pbStack_1d0 = (pointer)0x400000004;
  local_1c8 = 0;
  local_1c0 = &local_268;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pvStack_320 != &aStack_310) {
    operator_delete(pvStack_320,aStack_310._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_328 = (undefined1  [8])0x600000000;
  pvStack_320 = (void *)CONCAT44(pvStack_320._4_4_,1);
  local_318 = iterate::quadIndices;
  glu::draw(((local_360->super_TestCase).m_context)->m_renderCtx,local_78,1,
            (VertexArrayBinding *)local_208,(PrimitiveList *)local_328,(DrawUtilCallback *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
  }
  local_350._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"a_position","");
  local_328._0_4_ = 1;
  pvStack_320 = &aStack_310;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pvStack_320,local_350._M_dataplus._M_p,
             local_350._M_dataplus._M_p + local_350._M_string_length);
  local_300 = 0;
  local_208._0_4_ = local_328._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pvStack_320,(long)local_318 + (long)pvStack_320);
  local_1e0 = local_300;
  local_1d8 = (pointer)0x8;
  pbStack_1d0 = (pointer)0x400000004;
  local_1c8 = 0;
  local_1c0 = (value_type *)local_2d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pvStack_320 != &aStack_310) {
    operator_delete(pvStack_320,aStack_310._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_328 = (undefined1  [8])0x600000000;
  pvStack_320 = (void *)CONCAT44(pvStack_320._4_4_,1);
  local_318 = iterate::quadIndices;
  glu::draw(((local_360->super_TestCase).m_context)->m_renderCtx,local_78,1,
            (VertexArrayBinding *)local_208,(PrimitiveList *)local_328,(DrawUtilCallback *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p,local_1f0._M_allocated_capacity + 1);
  }
  dVar8 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar8,"Draw base quads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
                  ,0xc5);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
  pFVar17 = local_360;
  pRVar2 = ((local_360->super_TestCase).m_context)->m_renderCtx;
  local_328 = (undefined1  [8])&local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,
             "${VERSION_DECL}\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main (void)\n{\n   gl_Position = a_position;\n   v_coord = a_coord;\n}\n"
             ,"");
  specializeVersion((string *)local_2d8,(string *)local_328,pFVar17->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,(char *)local_2d8,(allocator<char> *)&local_130);
  specializeVersion(&local_2f8,&local_360->m_fragSrc,local_360->m_glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,local_2f8._M_dataplus._M_p,&local_365);
  local_158[0x10] = 0;
  local_158._17_8_ = 0;
  local_158._0_8_ = (pointer)0x0;
  local_158[8] = 0;
  local_158._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_208,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208,&local_268);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1f0,&local_350);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_110,pRVar2,(ProgramSources *)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_178);
  lVar14 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_208 + lVar14));
    lVar14 = lVar14 + -0x18;
  } while (lVar14 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != (undefined1  [8])&local_2c8) {
    operator_delete((void *)local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328,(long)local_318 + 1);
  }
  glu::operator<<(local_278,(ShaderProgram *)local_110);
  if (local_50 == false) {
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
               ,0xd0);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_318 = (deUint16 *)0x3f800000;
  aStack_310._0_8_ = &DAT_3f8000003f800000;
  local_328 = (undefined1  [8])0x0;
  pvStack_320 = (void *)0x3f80000000000000;
  local_238 = &DAT_3f8000003f800000;
  uStack_230 = 0x3f800000bf800000;
  local_248 = 0xbf8000003f800000;
  uStack_240 = 0x3f80000000000000;
  local_268.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_268.field_2._8_8_ = 0x3f80000000000000;
  local_268._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_268._M_string_length = (size_type)&DAT_3f8000003f800000;
  (**(code **)(lVar11 + 0x1680))(local_78);
  (**(code **)(lVar11 + 0x4a0))(local_360->m_compareFunc);
  pcVar3 = *(code **)(lVar11 + 0x15a0);
  uVar9 = (**(code **)(lVar11 + 0xb48))(local_78,"u_color");
  (*pcVar3)(0,0x3f800000,0,0x3f800000,uVar9);
  deqp::setupDefaultUniforms(((local_360->super_TestCase).m_context)->m_renderCtx,local_78);
  local_350._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"a_position","");
  local_2d8._0_4_ = 1;
  pvVar4 = (void *)((long)&local_2c8 + 8);
  puStack_2d0 = (undefined1 *)pvVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_2d0,local_350._M_dataplus._M_p,
             local_350._M_dataplus._M_p + local_350._M_string_length);
  uStack_2b0 = uStack_2b0 & 0xffffffff00000000;
  local_208._0_4_ = local_2d8._0_4_;
  local_200._M_p = (pointer)&local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,puStack_2d0,(long)puStack_2d0 + local_2c8._M_allocated_capacity);
  local_1e0 = (int)uStack_2b0;
  local_1d8 = (pointer)0x8;
  pbStack_1d0 = (pointer)0x400000004;
  local_1c8 = 0;
  local_1c0 = &local_268;
  if (puStack_2d0 != (undefined1 *)pvVar4) {
    operator_delete(puStack_2d0,local_2c8._8_8_ + 1);
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"a_coord","");
  local_2d8._0_4_ = 1;
  puStack_2d0 = (undefined1 *)pvVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_2d0,local_2f8._M_dataplus._M_p,
             local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
  uStack_2b0 = uStack_2b0 & 0xffffffff00000000;
  local_1b8 = local_2d8._0_4_;
  pbVar16 = &local_1a0;
  local_1b0[0] = pbVar16;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1b0,puStack_2d0,(long)puStack_2d0 + local_2c8._M_allocated_capacity);
  local_1a0.field_2._M_allocated_capacity._0_4_ = (int)uStack_2b0;
  local_1a0.field_2._8_8_ = (pointer)0x8;
  pbStack_180 = (pointer)0x400000002;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_178.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_328;
  if (puStack_2d0 != (undefined1 *)pvVar4) {
    operator_delete(puStack_2d0,local_2c8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != paVar1) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  local_2d8 = (undefined1  [8])0x600000000;
  puStack_2d0 = (undefined1 *)CONCAT44(puStack_2d0._4_4_,1);
  local_2c8._M_allocated_capacity = (size_type)iterate::quadIndices;
  glu::draw(((local_360->super_TestCase).m_context)->m_renderCtx,local_78,2,
            (VertexArrayBinding *)local_208,(PrimitiveList *)local_2d8,(DrawUtilCallback *)0x0);
  lVar14 = -0xa0;
  do {
    if (pbVar16 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pbVar16[-1].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar16[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar16->_M_dataplus)._M_p + 1));
    }
    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pbVar16[-3].field_2;
    lVar14 = lVar14 + 0x50;
  } while (lVar14 != 0);
  dVar8 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar8,"Draw test quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcFragDepthTests.cpp"
                  ,0xe4);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
  pFVar17 = local_360;
  pRVar2 = ((local_360->super_TestCase).m_context)->m_renderCtx;
  local_208._0_4_ = RGBA;
  local_208._4_4_ = UNORM_INT8;
  if ((void *)local_220.m_pixels.m_cap != (void *)0x0) {
    local_220.m_pixels.m_cap = (size_t)local_220.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_110,(TextureFormat *)local_208,local_220.m_width,
             local_220.m_height,1,(void *)local_220.m_pixels.m_cap);
  glu::readPixels(pRVar2,(int)local_364,(int)local_354,(PixelBufferAccess *)local_110);
  if (0 < local_290.m_height) {
    iVar7 = 0;
    do {
      iVar10 = (int)((float)local_290.m_width * 0.5 + 0.5);
      local_364 = ((float)iVar7 + 0.5) / (float)local_290.m_height;
      iVar15 = local_290.m_width;
      if (iVar10 < local_290.m_width) {
        iVar15 = iVar10;
      }
      if (iVar10 < 0) {
        iVar15 = 0;
      }
      if (0 < iVar15) {
        iVar10 = 0;
        do {
          local_110._0_4_ = ((float)iVar10 + 0.5) / (float)local_290.m_width;
          local_110._4_4_ = local_364;
          fVar18 = (*pFVar17->m_evalFunc)((Vec2 *)local_110);
          switch(pFVar17->m_compareFunc) {
          case 0x201:
            bVar6 = 0.55 < fVar18;
            goto LAB_00d8fa5e;
          case 0x202:
            bVar6 = fVar18 == 0.55;
            break;
          case 0x203:
            bVar6 = 0.55 < fVar18;
            goto LAB_00d8fa80;
          case 0x204:
            bVar6 = fVar18 < 0.55;
LAB_00d8fa5e:
            bVar6 = !bVar6 && fVar18 != 0.55;
            break;
          case 0x205:
            bVar6 = fVar18 != 0.55;
            break;
          case 0x206:
            bVar6 = fVar18 < 0.55;
LAB_00d8fa80:
            bVar6 = !bVar6;
            break;
          case 0x207:
            bVar6 = true;
            break;
          default:
            bVar6 = false;
          }
          uVar9 = 0xffff0000;
          if (bVar6) {
            uVar9 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_290.m_pixels.m_ptr + (long)(local_290.m_width * iVar7 + iVar10) * 4) = uVar9
          ;
          iVar10 = iVar10 + 1;
        } while (iVar15 != iVar10);
      }
      if (iVar15 < local_290.m_width) {
        local_26c = (float)iVar15;
        iVar10 = iVar15;
        do {
          iVar5 = local_290.m_width;
          pFVar17 = local_360;
          local_354 = (float)iVar10;
          local_110._0_4_ = (local_354 + 0.5) / (float)local_290.m_width;
          local_110._4_4_ = local_364;
          fVar18 = (*local_360->m_evalFunc)((Vec2 *)local_110);
          if (6 < pFVar17->m_compareFunc - 0x201) {
            bVar6 = false;
            goto LAB_00d8fbc6;
          }
          fVar19 = 1.0 - (((local_354 - local_26c) + 0.5) / (float)(iVar5 - iVar15) + local_364) *
                         0.5;
          switch(pFVar17->m_compareFunc) {
          case 0x201:
            bVar6 = fVar19 < fVar18;
            goto LAB_00d8fba5;
          case 0x202:
            bVar6 = fVar18 == fVar19;
            break;
          case 0x203:
            bVar6 = fVar19 < fVar18;
            goto LAB_00d8fbbf;
          case 0x204:
            bVar6 = fVar18 < fVar19;
LAB_00d8fba5:
            bVar6 = !bVar6 && fVar18 != fVar19;
            break;
          case 0x205:
            bVar6 = fVar18 != fVar19;
            break;
          case 0x206:
            bVar6 = fVar18 < fVar19;
LAB_00d8fbbf:
            bVar6 = !bVar6;
            break;
          case 0x207:
            bVar6 = true;
          }
LAB_00d8fbc6:
          uVar9 = 0xffff0000;
          if (bVar6) {
            uVar9 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)local_290.m_pixels.m_ptr + (long)(local_290.m_width * iVar7 + iVar10) * 4) = uVar9
          ;
          iVar10 = iVar10 + 1;
        } while (iVar10 < local_290.m_width);
      }
      iVar7 = iVar7 + 1;
      pFVar17 = local_360;
    } while (iVar7 < local_290.m_height);
  }
  bVar6 = tcu::fuzzyCompare(local_278,"Result","Image comparison result",&local_290,&local_220,0.05,
                            COMPARE_LOG_RESULT);
  description = "Fail";
  if (bVar6) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((pFVar17->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar6,
             description);
  tcu::Surface::~Surface(&local_290);
  tcu::Surface::~Surface(&local_220);
  return STOP;
}

Assistant:

FragDepthCompareCase::IterateResult FragDepthCompareCase::iterate(void)
{
	TestLog&				 log = m_testCtx.getLog();
	const glw::Functions&	gl  = m_context.getRenderContext().getFunctions();
	de::Random				 rnd(deStringHash(getName()));
	const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
	int						 viewportW	= de::min(128, renderTarget.getWidth());
	int						 viewportH	= de::min(128, renderTarget.getHeight());
	int						 viewportX	= rnd.getInt(0, renderTarget.getWidth() - viewportW);
	int						 viewportY	= rnd.getInt(0, renderTarget.getHeight() - viewportH);
	tcu::Surface			 renderedFrame(viewportW, viewportH);
	tcu::Surface			 referenceFrame(viewportW, viewportH);
	const float				 constDepth = 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	gl.viewport(viewportX, viewportY, viewportW, viewportH);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		glu::ShaderProgram basicQuadProgram(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(s_vertexShaderSrc, m_glslVersion).c_str(),
									specializeVersion(s_defaultFragmentShaderSrc, m_glslVersion).c_str()));

		if (!basicQuadProgram.isOk())
		{
			log << basicQuadProgram;
			TCU_FAIL("Compile failed");
		}

		const float constDepthCoord[] = { -1.0f, -1.0f, constDepth, 1.0f, -1.0f, +1.0f, constDepth, 1.0f,
										  0.0f,  -1.0f, constDepth, 1.0f, 0.0f,  +1.0f, constDepth, 1.0f };
		const float varyingDepthCoord[] = { 0.0f,  -1.0f, +1.0f, 1.0f, 0.0f,  +1.0f, 0.0f,  1.0f,
											+1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		gl.useProgram(basicQuadProgram.getProgram());
		gl.uniform4f(gl.getUniformLocation(basicQuadProgram.getProgram(), "u_color"), 0.0f, 0.0f, 1.0f, 1.0f);
		gl.depthFunc(GL_ALWAYS);

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &constDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		{
			glu::VertexArrayBinding posBinding = glu::va::Float("a_position", 4, 4, 0, &varyingDepthCoord[0]);
			glu::draw(m_context.getRenderContext(), basicQuadProgram.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw base quads");
	}

	// Render with depth test.
	{
		glu::ShaderProgram program(m_context.getRenderContext(),
								   glu::makeVtxFragSources(specializeVersion(s_vertexShaderSrc, m_glslVersion).c_str(),
														   specializeVersion(m_fragSrc, m_glslVersion).c_str()));
		log << program;

		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const float coord[]	= { 0.0f, 0.0f, 0.0f, 1.0f, 1.0f, 0.0f, 1.0f, 1.0f };
		const float position[] = { -1.0f, -1.0f, +1.0f, 1.0f, -1.0f, +1.0f, 0.0f,  1.0f,
								   +1.0f, -1.0f, 0.0f,  1.0f, +1.0f, +1.0f, -1.0f, 1.0f };

		gl.useProgram(program.getProgram());
		gl.depthFunc(m_compareFunc);
		gl.uniform4f(gl.getUniformLocation(program.getProgram(), "u_color"), 0.0f, 1.0f, 0.0f, 1.0f);

		// Setup default helper uniforms.
		setupDefaultUniforms(m_context.getRenderContext(), program.getProgram());

		{
			glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("a_position", 4, 4, 0, &position[0]),
													   glu::va::Float("a_coord", 2, 4, 0, &coord[0]) };
			glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
					  &vertexArrays[0], glu::pr::Triangles(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw test quad");
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float yf   = ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int   half = de::clamp((int)((float)referenceFrame.getWidth() * 0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float xf	= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float d		= m_evalFunc(Vec2(xf, yf));
			bool  dpass = compare(m_compareFunc, d, constDepth * 0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float xf	= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float xh	= ((float)x - (float)half + 0.5f) / (float)(referenceFrame.getWidth() - half);
			float rd	= 1.0f - (xh + yf) * 0.5f;
			float d		= m_evalFunc(Vec2(xf, yf));
			bool  dpass = compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f,
								  tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}